

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

void QGuiApplicationPrivate::processWindowSystemEvent(WindowSystemEvent *e)

{
  QObject *pQVar1;
  QEvent *this;
  
  pQVar1 = QCoreApplication::self;
  switch(e->type) {
  case GeometryChange:
    processGeometryChangeEvent((GeometryChangeEvent *)e);
    return;
  case 3:
  case 4:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case ScreenAvailableGeometry:
  case 0x13:
  case 0x14:
  case ScreenRefreshRate|FocusWindow:
  case ScreenRefreshRate|WindowStateChanged:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case ScreenRefreshRate|ScreenOrientation:
  case ScreenRefreshRate|ScreenGeometry:
  case ScreenRefreshRate|ScreenAvailableGeometry:
  case ScreenRefreshRate|ScreenLogicalDotsPerInch:
    goto switchD_002d1e65_caseD_3;
  case FocusWindow:
    processFocusWindowEvent((FocusWindowEvent *)e);
    return;
  case WindowStateChanged:
    processWindowStateChangedEvent((WindowStateChangedEvent *)e);
    return;
  case ScreenOrientation:
    processScreenOrientationChange((ScreenOrientationEvent *)e);
    return;
  case ScreenGeometry:
    processScreenGeometryChange((ScreenGeometryEvent *)e);
    return;
  case ScreenLogicalDotsPerInch:
    processScreenLogicalDotsPerInchChange((ScreenLogicalDotsPerInchEvent *)e);
    return;
  case ScreenRefreshRate:
    processScreenRefreshRateChange((ScreenRefreshRateEvent *)e);
    return;
  case ThemeChange:
    processThemeChanged((ThemeChangeEvent *)e);
    return;
  case Expose:
    processExposeEvent((ExposeEvent *)e);
    return;
  case ApplicationStateChanged:
    setApplicationState(*(ApplicationState *)&e->field_0x14,*(bool *)&e[1]._vptr_WindowSystemEvent);
    return;
  case FlushEvents:
    QWindowSystemInterface::deferredFlushWindowSystemEvents
              ((QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)
               *(QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4> *)&e->field_0x14);
    return;
  case WindowScreenChanged:
    processWindowScreenChangedEvent((WindowScreenChangedEvent *)e);
    return;
  case SafeAreaMarginsChanged:
    processSafeAreaMarginsChangedEvent((SafeAreaMarginsChangedEvent *)e);
    return;
  case ApplicationTermination:
    processApplicationTermination(e);
    return;
  case Paint:
    processPaintEvent((PaintEvent *)e);
    return;
  case WindowDevicePixelRatioChanged:
    processWindowDevicePixelRatioChangedEvent((WindowDevicePixelRatioChangedEvent *)e);
    return;
  default:
    switch(e->type) {
    case Close:
      processCloseEvent((CloseEvent *)e);
      return;
    case Enter:
      processEnterEvent((EnterEvent *)e);
      return;
    case Leave:
      processLeaveEvent((LeaveEvent *)e);
      return;
    case Mouse:
      processMouseEvent((MouseEvent *)e);
      return;
    case Wheel:
      processWheelEvent((WheelEvent *)e);
      return;
    case Key:
      processKeyEvent((KeyEvent *)e);
      return;
    case Touch:
      processTouchEvent((TouchEvent *)e);
      return;
    case FileOpen:
      processFileOpenEvent((FileOpenEvent *)e);
      return;
    case Tablet:
      processTabletEvent((TabletEvent *)e);
      return;
    case TabletEnterProximity:
      processTabletEnterProximityEvent((TabletEnterProximityEvent *)e);
      return;
    case TabletLeaveProximity:
      processTabletLeaveProximityEvent((TabletLeaveProximityEvent *)e);
      return;
    case PlatformPanel:
      processPlatformPanelEvent((PlatformPanelEvent *)e);
      return;
    case ContextMenu:
      processContextMenuEvent((ContextMenuEvent *)e);
      return;
    case EnterWhatsThisMode:
      this = (QEvent *)operator_new(0x10);
      QEvent::QEvent(this,EnterWhatsThisMode);
      QCoreApplication::postEvent(pQVar1,this,0);
      return;
    case Gesture:
      processGestureEvent((GestureEvent *)e);
      return;
    }
switchD_002d1e65_caseD_3:
    processWindowSystemEvent((QGuiApplicationPrivate *)&e->type);
    return;
  }
}

Assistant:

QGuiApplicationPrivate::processWindowSystemEvent(QWindowSystemInterfacePrivate::WindowSystemEvent *e)
{
    Q_TRACE_PARAM_REPLACE(QWindowSystemInterfacePrivate::WindowSystemEvent *, int);
    Q_TRACE_SCOPE(QGuiApplicationPrivate_processWindowSystemEvent, e->type);

    switch(e->type) {
    case QWindowSystemInterfacePrivate::Mouse:
        QGuiApplicationPrivate::processMouseEvent(static_cast<QWindowSystemInterfacePrivate::MouseEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Wheel:
        QGuiApplicationPrivate::processWheelEvent(static_cast<QWindowSystemInterfacePrivate::WheelEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Key:
        QGuiApplicationPrivate::processKeyEvent(static_cast<QWindowSystemInterfacePrivate::KeyEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Touch:
        QGuiApplicationPrivate::processTouchEvent(static_cast<QWindowSystemInterfacePrivate::TouchEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::GeometryChange:
        QGuiApplicationPrivate::processGeometryChangeEvent(static_cast<QWindowSystemInterfacePrivate::GeometryChangeEvent*>(e));
        break;
    case QWindowSystemInterfacePrivate::Enter:
        QGuiApplicationPrivate::processEnterEvent(static_cast<QWindowSystemInterfacePrivate::EnterEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Leave:
        QGuiApplicationPrivate::processLeaveEvent(static_cast<QWindowSystemInterfacePrivate::LeaveEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::FocusWindow:
        QGuiApplicationPrivate::processFocusWindowEvent(static_cast<QWindowSystemInterfacePrivate::FocusWindowEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowStateChanged:
        QGuiApplicationPrivate::processWindowStateChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowStateChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowScreenChanged:
        QGuiApplicationPrivate::processWindowScreenChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowScreenChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::WindowDevicePixelRatioChanged:
        QGuiApplicationPrivate::processWindowDevicePixelRatioChangedEvent(static_cast<QWindowSystemInterfacePrivate::WindowDevicePixelRatioChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::SafeAreaMarginsChanged:
        QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(static_cast<QWindowSystemInterfacePrivate::SafeAreaMarginsChangedEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ApplicationStateChanged: {
        QWindowSystemInterfacePrivate::ApplicationStateChangedEvent * changeEvent = static_cast<QWindowSystemInterfacePrivate::ApplicationStateChangedEvent *>(e);
        QGuiApplicationPrivate::setApplicationState(changeEvent->newState, changeEvent->forcePropagate); }
        break;
    case QWindowSystemInterfacePrivate::ApplicationTermination:
        QGuiApplicationPrivate::processApplicationTermination(e);
        break;
    case QWindowSystemInterfacePrivate::FlushEvents: {
        QWindowSystemInterfacePrivate::FlushEventsEvent *flushEventsEvent = static_cast<QWindowSystemInterfacePrivate::FlushEventsEvent *>(e);
        QWindowSystemInterface::deferredFlushWindowSystemEvents(flushEventsEvent->flags); }
        break;
    case QWindowSystemInterfacePrivate::Close:
        QGuiApplicationPrivate::processCloseEvent(
                static_cast<QWindowSystemInterfacePrivate::CloseEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenOrientation:
        QGuiApplicationPrivate::processScreenOrientationChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenOrientationEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenGeometry:
        QGuiApplicationPrivate::processScreenGeometryChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenGeometryEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInch:
        QGuiApplicationPrivate::processScreenLogicalDotsPerInchChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ScreenRefreshRate:
        QGuiApplicationPrivate::processScreenRefreshRateChange(
                static_cast<QWindowSystemInterfacePrivate::ScreenRefreshRateEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::ThemeChange:
        QGuiApplicationPrivate::processThemeChanged(
                    static_cast<QWindowSystemInterfacePrivate::ThemeChangeEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Expose:
        QGuiApplicationPrivate::processExposeEvent(static_cast<QWindowSystemInterfacePrivate::ExposeEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Paint:
        QGuiApplicationPrivate::processPaintEvent(static_cast<QWindowSystemInterfacePrivate::PaintEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::Tablet:
        QGuiApplicationPrivate::processTabletEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::TabletEnterProximity:
        QGuiApplicationPrivate::processTabletEnterProximityEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletEnterProximityEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::TabletLeaveProximity:
        QGuiApplicationPrivate::processTabletLeaveProximityEvent(
                    static_cast<QWindowSystemInterfacePrivate::TabletLeaveProximityEvent *>(e));
        break;
#ifndef QT_NO_GESTURES
    case QWindowSystemInterfacePrivate::Gesture:
        QGuiApplicationPrivate::processGestureEvent(
                    static_cast<QWindowSystemInterfacePrivate::GestureEvent *>(e));
        break;
#endif
    case QWindowSystemInterfacePrivate::PlatformPanel:
        QGuiApplicationPrivate::processPlatformPanelEvent(
                    static_cast<QWindowSystemInterfacePrivate::PlatformPanelEvent *>(e));
        break;
    case QWindowSystemInterfacePrivate::FileOpen:
        QGuiApplicationPrivate::processFileOpenEvent(
                    static_cast<QWindowSystemInterfacePrivate::FileOpenEvent *>(e));
        break;
#ifndef QT_NO_CONTEXTMENU
        case QWindowSystemInterfacePrivate::ContextMenu:
        QGuiApplicationPrivate::processContextMenuEvent(
                    static_cast<QWindowSystemInterfacePrivate::ContextMenuEvent *>(e));
        break;
#endif
    case QWindowSystemInterfacePrivate::EnterWhatsThisMode:
        QGuiApplication::postEvent(QGuiApplication::instance(), new QEvent(QEvent::EnterWhatsThisMode));
        break;
    default:
        qWarning() << "Unknown user input event type:" << e->type;
        break;
    }
}